

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_writeFrameHeader
                 (void *dst,size_t dstCapacity,ZSTD_CCtx_params params,U64 pledgedSrcSize,U32 dictID
                 )

{
  size_t sVar1;
  void *memPtr;
  char cVar2;
  uint in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  bool bVar3;
  int in_stack_00000008;
  byte in_stack_0000000c;
  int in_stack_00000028;
  int in_stack_0000002c;
  size_t pos;
  BYTE frameHeaderDecriptionByte;
  U32 fcsCode;
  BYTE windowLogByte;
  U32 singleSegment;
  U32 windowSize;
  U32 checksumFlag;
  U32 dictIDSizeCode;
  U32 dictIDSizeCodeLength;
  BYTE *op;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  U16 in_stack_ffffffffffffff7e;
  void *in_stack_ffffffffffffff80;
  uint local_6c;
  bool local_65;
  size_t local_58;
  size_t local_8;
  
  cVar2 = (in_ECX != 0) + (0xff < in_ECX) + (0xffff < in_ECX);
  if ((int)pos != 0) {
    cVar2 = '\0';
  }
  bVar3 = in_RDX <= (uint)(1 << (in_stack_0000000c & 0x1f));
  local_65 = in_stack_00000028 != 0 && bVar3;
  if (in_stack_00000028 == 0) {
    local_6c = 0;
  }
  else {
    local_6c = (uint)(0xff < in_RDX) + (uint)(0x100ff < in_RDX) + (uint)(0xfffffffe < in_RDX);
  }
  local_58 = 0;
  if (in_RSI < 0x12) {
    local_8 = 0xffffffffffffffba;
  }
  else {
    if (in_stack_00000008 == 0) {
      MEM_writeLE32(in_stack_ffffffffffffff80,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
      local_58 = 4;
    }
    *(char *)(in_RDI + local_58) =
         cVar2 + (in_stack_0000002c != 0) * '\x04' + local_65 * ' ' + (char)(local_6c << 6);
    sVar1 = local_58 + 1;
    if (in_stack_00000028 == 0 || !bVar3) {
      *(byte *)(in_RDI + local_58 + 1) = (in_stack_0000000c - 10) * '\b';
      sVar1 = local_58 + 2;
    }
    local_58 = sVar1;
    switch(cVar2) {
    default:
      break;
    case '\x01':
      *(char *)(in_RDI + local_58) = (char)in_ECX;
      local_58 = local_58 + 1;
      break;
    case '\x02':
      MEM_writeLE16(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
      local_58 = local_58 + 2;
      break;
    case '\x03':
      MEM_writeLE32(in_stack_ffffffffffffff80,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
      local_58 = local_58 + 4;
    }
    memPtr = (void *)(ulong)local_6c;
    switch(memPtr) {
    default:
      if (local_65) {
        *(char *)(in_RDI + local_58) = (char)in_RDX;
        local_58 = local_58 + 1;
      }
      break;
    case (void *)0x1:
      MEM_writeLE16(memPtr,in_stack_ffffffffffffff7e);
      local_58 = local_58 + 2;
      break;
    case (void *)0x2:
      MEM_writeLE32(memPtr,CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
      local_58 = local_58 + 4;
      break;
    case (void *)0x3:
      MEM_writeLE64(memPtr,CONCAT26(in_stack_ffffffffffffff7e,
                                    CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
      local_58 = local_58 + 8;
    }
    local_8 = local_58;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_writeFrameHeader(void* dst, size_t dstCapacity,
                                    ZSTD_CCtx_params params, U64 pledgedSrcSize, U32 dictID)
{   BYTE* const op = (BYTE*)dst;
    U32   const dictIDSizeCodeLength = (dictID>0) + (dictID>=256) + (dictID>=65536);   /* 0-3 */
    U32   const dictIDSizeCode = params.fParams.noDictIDFlag ? 0 : dictIDSizeCodeLength;   /* 0-3 */
    U32   const checksumFlag = params.fParams.checksumFlag>0;
    U32   const windowSize = (U32)1 << params.cParams.windowLog;
    U32   const singleSegment = params.fParams.contentSizeFlag && (windowSize >= pledgedSrcSize);
    BYTE  const windowLogByte = (BYTE)((params.cParams.windowLog - ZSTD_WINDOWLOG_ABSOLUTEMIN) << 3);
    U32   const fcsCode = params.fParams.contentSizeFlag ?
                     (pledgedSrcSize>=256) + (pledgedSrcSize>=65536+256) + (pledgedSrcSize>=0xFFFFFFFFU) : 0;  /* 0-3 */
    BYTE  const frameHeaderDecriptionByte = (BYTE)(dictIDSizeCode + (checksumFlag<<2) + (singleSegment<<5) + (fcsCode<<6) );
    size_t pos=0;

    assert(!(params.fParams.contentSizeFlag && pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN));
    if (dstCapacity < ZSTD_frameHeaderSize_max) return ERROR(dstSize_tooSmall);
    DEBUGLOG(4, "ZSTD_writeFrameHeader : dictIDFlag : %u ; dictID : %u ; dictIDSizeCode : %u",
                !params.fParams.noDictIDFlag, dictID,  dictIDSizeCode);

    if (params.format == ZSTD_f_zstd1) {
        MEM_writeLE32(dst, ZSTD_MAGICNUMBER);
        pos = 4;
    }
    op[pos++] = frameHeaderDecriptionByte;
    if (!singleSegment) op[pos++] = windowLogByte;
    switch(dictIDSizeCode)
    {
        default:  assert(0); /* impossible */
        case 0 : break;
        case 1 : op[pos] = (BYTE)(dictID); pos++; break;
        case 2 : MEM_writeLE16(op+pos, (U16)dictID); pos+=2; break;
        case 3 : MEM_writeLE32(op+pos, dictID); pos+=4; break;
    }
    switch(fcsCode)
    {
        default:  assert(0); /* impossible */
        case 0 : if (singleSegment) op[pos++] = (BYTE)(pledgedSrcSize); break;
        case 1 : MEM_writeLE16(op+pos, (U16)(pledgedSrcSize-256)); pos+=2; break;
        case 2 : MEM_writeLE32(op+pos, (U32)(pledgedSrcSize)); pos+=4; break;
        case 3 : MEM_writeLE64(op+pos, (U64)(pledgedSrcSize)); pos+=8; break;
    }
    return pos;
}